

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O3

optional_idx
duckdb::GetFunctionDescriptionIndex
          (vector<duckdb::FunctionDescription,_true> *function_descriptions,
          vector<duckdb::LogicalType,_true> *function_parameter_types)

{
  pointer pFVar1;
  pointer pFVar2;
  pointer pLVar3;
  pointer pLVar4;
  optional_idx oVar5;
  bool bVar6;
  reference pvVar7;
  reference pvVar8;
  reference rhs;
  const_reference rhs_00;
  idx_t iVar9;
  size_type __n;
  ulong __n_00;
  idx_t iVar10;
  size_type __n_01;
  optional_idx specificity_score;
  optional_idx best_specificity_score;
  idx_t local_70;
  optional_idx local_58;
  optional_idx local_50;
  LogicalType local_48;
  
  pFVar1 = (function_descriptions->
           super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>).
           super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = (function_descriptions->
           super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>).
           super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pFVar2 - (long)pFVar1 == 0x80) {
    pLVar3 = (function_parameter_types->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar4 = (function_parameter_types->
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_70 = 0;
    pvVar7 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,0);
    if ((pvVar7->parameter_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar7->parameter_types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_70 = 0;
      __n_00 = 0;
      do {
        if (__n_00 < (ulong)(((long)pLVar3 - (long)pLVar4 >> 3) * -0x5555555555555555)) {
          pvVar7 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,0);
          pvVar8 = vector<duckdb::LogicalType,_true>::operator[](&pvVar7->parameter_types,__n_00);
          LogicalType::LogicalType(&local_48,ANY);
          bVar6 = LogicalType::operator==(pvVar8,&local_48);
          if (bVar6) {
            LogicalType::~LogicalType(&local_48);
          }
          else {
            pvVar7 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,0);
            pvVar8 = vector<duckdb::LogicalType,_true>::operator[](&pvVar7->parameter_types,__n_00);
            rhs = vector<duckdb::LogicalType,_true>::operator[](function_parameter_types,__n_00);
            bVar6 = LogicalType::operator==(pvVar8,rhs);
            LogicalType::~LogicalType(&local_48);
            if (!bVar6) {
              return (optional_idx)0xffffffffffffffff;
            }
          }
        }
        __n_00 = __n_00 + 1;
        pvVar7 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,0);
      } while (__n_00 < (ulong)(((long)(pvVar7->parameter_types).
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       .
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar7->parameter_types).
                                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       .
                                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
  }
  else {
    local_50.index = 0xffffffffffffffff;
    local_70 = 0xffffffffffffffff;
    local_58.index = 0xffffffffffffffff;
    if (pFVar2 != pFVar1) {
      local_70 = 0xffffffffffffffff;
      __n = 0;
      do {
        pvVar7 = vector<duckdb::FunctionDescription,_true>::operator[](function_descriptions,__n);
        pLVar3 = (pvVar7->parameter_types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pLVar4 = (pvVar7->parameter_types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if ((long)pLVar4 - (long)pLVar3 ==
            (long)(function_parameter_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(function_parameter_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          if (pLVar4 == pLVar3) {
            iVar10 = 0;
          }
          else {
            __n_01 = 0;
            iVar10 = 0;
            do {
              pvVar8 = vector<duckdb::LogicalType,_true>::operator[]
                                 (&pvVar7->parameter_types,__n_01);
              if (pvVar8->id_ == ANY) {
                iVar10 = iVar10 + 1;
              }
              else {
                pvVar8 = vector<duckdb::LogicalType,_true>::operator[]
                                   (&pvVar7->parameter_types,__n_01);
                rhs_00 = vector<duckdb::LogicalType,_true>::operator[]
                                   (function_parameter_types,__n_01);
                bVar6 = LogicalType::operator==(pvVar8,rhs_00);
                if (!bVar6) goto LAB_00a39caf;
              }
              __n_01 = __n_01 + 1;
            } while (__n_01 < (ulong)(((long)(pvVar7->parameter_types).
                                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             .
                                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pvVar7->parameter_types).
                                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             .
                                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                     -0x5555555555555555));
          }
          optional_idx::optional_idx((optional_idx *)&local_48,iVar10);
          oVar5.index._0_1_ = local_48.id_;
          oVar5.index._1_1_ = local_48.physical_type_;
          oVar5.index._2_6_ = local_48._2_6_;
          local_58.index._0_1_ = local_48.id_;
          local_58.index._1_1_ = local_48.physical_type_;
          local_58.index._2_6_ = local_48._2_6_;
          if (local_48._0_8_ != 0xffffffffffffffff) {
            if (local_50.index != 0xffffffffffffffff) {
              iVar10 = optional_idx::GetIndex(&local_58);
              iVar9 = optional_idx::GetIndex(&local_50);
              oVar5.index = local_58.index;
              if (iVar9 <= iVar10) goto LAB_00a39cbd;
            }
            local_50.index = local_58.index;
            optional_idx::optional_idx((optional_idx *)&local_48,__n);
            local_70._0_1_ = local_48.id_;
            local_70._1_1_ = local_48.physical_type_;
            local_70._2_6_ = local_48._2_6_;
            oVar5.index = local_58.index;
          }
        }
        else {
LAB_00a39caf:
          local_58.index = 0xffffffffffffffff;
          oVar5.index = local_58.index;
        }
LAB_00a39cbd:
        local_58.index = oVar5.index;
        __n = __n + 1;
      } while (__n < (ulong)((long)(function_descriptions->
                                   super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                                   ).
                                   super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(function_descriptions->
                                   super_vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                                   ).
                                   super__Vector_base<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7));
    }
  }
  return (optional_idx)local_70;
}

Assistant:

static optional_idx GetFunctionDescriptionIndex(vector<FunctionDescription> &function_descriptions,
                                                vector<LogicalType> &function_parameter_types) {
	if (function_descriptions.size() == 1) {
		// one description, use it even if nr of parameters don't match
		idx_t nr_function_parameters = function_parameter_types.size();
		for (idx_t i = 0; i < function_descriptions[0].parameter_types.size(); i++) {
			if (i < nr_function_parameters && function_descriptions[0].parameter_types[i] != LogicalTypeId::ANY &&
			    function_descriptions[0].parameter_types[i] != function_parameter_types[i]) {
				return optional_idx::Invalid();
			}
		}
		return optional_idx(0);
	}

	// multiple descriptions, search most specific description
	optional_idx best_description_idx;
	// specificity_score: 0: exact type match; N: match using N <ANY> values; Invalid(): no match
	optional_idx best_specificity_score;
	optional_idx specificity_score;
	for (idx_t descr_idx = 0; descr_idx < function_descriptions.size(); descr_idx++) {
		specificity_score = CalcDescriptionSpecificity(function_descriptions[descr_idx], function_parameter_types);
		if (specificity_score.IsValid() &&
		    (!best_specificity_score.IsValid() || specificity_score.GetIndex() < best_specificity_score.GetIndex())) {
			best_specificity_score = specificity_score;
			best_description_idx = descr_idx;
		}
	}
	return best_description_idx;
}